

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void wasm::ModuleUtils::
     renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>
               (Module *wasm,
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *map)

{
  size_type *psVar1;
  _Base_ptr p_Var2;
  Function *pFVar3;
  Function *pFVar4;
  _Rb_tree_node_base *p_Var5;
  iterator iVar6;
  PassRunner local_258;
  undefined1 local_140 [8];
  Updater updater;
  
  p_Var5 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(map->_M_t)._M_impl.super__Rb_tree_header) {
      Module::updateMaps(wasm);
      psVar1 = &updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
                super_Pass.name._M_string_length;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      ._vptr_Pass = (_func_int **)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      .name._M_dataplus._M_p = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      .name._M_string_length._0_1_ = 0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      .name.field_2._8_8_ = 0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.replacep = (Expression **)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.fixed._M_elems[9].currp =
           (Expression **)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task,_std::allocator<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task,_std::allocator<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task,_std::allocator<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.currFunction = (Function *)0x0;
      local_140 = (undefined1  [8])&PTR__WalkerPass_00d72ad8;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.super_Pass
      .runner = (PassRunner *)psVar1;
      updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
      super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
      super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.currModule = (Module *)map;
      iVar6 = std::
              _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::find(&map->_M_t,&wasm->start);
      if (iVar6._M_node !=
          (_Base_ptr)
          &((updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
             super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
             super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.currModule)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var2 = iVar6._M_node[1]._M_right;
        (wasm->start).super_IString.str._M_len = (size_t)iVar6._M_node[1]._M_left;
        (wasm->start).super_IString.str._M_str = (char *)p_Var2;
      }
      local_258.options.arguments._M_h._M_buckets =
           &local_258.options.arguments._M_h._M_single_bucket;
      local_258._vptr_PassRunner = (_func_int **)&PTR__PassRunner_00d727e0;
      local_258.allocator = &wasm->allocator;
      local_258.passes.
      super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.passes.
      super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_258.passes.
      super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_258.passes.
      super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_258._41_8_ = 0;
      local_258.options.validate = true;
      local_258.options.validateGlobally = true;
      local_258.options.optimizeLevel = 0;
      local_258.options.shrinkLevel = 0;
      local_258.options.inlining.alwaysInlineMaxSize = 2;
      local_258.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
      local_258.options.inlining.flexibleInlineMaxSize = 0x14;
      local_258.options.inlining.allowFunctionsWithLoops = false;
      local_258.options.zeroFilledMemory = false;
      local_258.options.closedWorld = false;
      local_258.options.debugInfo = false;
      local_258.options.targetJS = false;
      local_258.options.inlining.partialInliningIfs = 0;
      local_258.options.ignoreImplicitTraps = false;
      local_258.options.trapsNeverHappen = false;
      local_258.options.lowMemoryUnused = false;
      local_258.options.fastMath = false;
      local_258.options.arguments._M_h._M_bucket_count = 1;
      local_258.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_258.options.arguments._M_h._M_element_count = 0;
      local_258.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_258.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
      local_258.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_258.options.passesToSkip._M_h._M_buckets =
           &local_258.options.passesToSkip._M_h._M_single_bucket;
      local_258.options.passesToSkip._M_h._M_bucket_count = 1;
      local_258.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_258.options.passesToSkip._M_h._M_element_count = 0;
      local_258.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_258.skippedPasses._M_h._M_buckets = &local_258.skippedPasses._M_h._M_single_bucket;
      local_258.options.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_258.options.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_7_ = 0;
      local_258._215_4_ = 0;
      local_258.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
      local_258.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_258.skippedPasses._M_h._M_bucket_count = 1;
      local_258.skippedPasses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_258.skippedPasses._M_h._M_element_count = 0;
      local_258.skippedPasses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_258.skippedPasses._M_h._M_rehash_policy._M_next_resize = 0;
      local_258.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_258.wasm = wasm;
      WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>::run
                ((WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_> *)local_140,
                 &local_258,wasm);
      WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>::runOnModuleCode
                ((WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_> *)local_140,
                 &local_258,wasm);
      PassRunner::~PassRunner(&local_258);
      if (updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
          super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
          super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.fixed._M_elems[9].currp !=
          (Expression **)0x0) {
        operator_delete(updater.
                        super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
                        super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
                        super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.fixed._M_elems[9]
                        .currp,(long)updater.
                                     super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>
                                     .super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
                                     super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.
                                     flexible.
                                     super__Vector_base<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task,_std::allocator<wasm::Walker<Updater,_wasm::Visitor<Updater,_void>_>::Task>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)updater.
                                     super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>
                                     .super_PostWalker<Updater,_wasm::Visitor<Updater,_void>_>.
                                     super_Walker<Updater,_wasm::Visitor<Updater,_void>_>.stack.
                                     fixed._M_elems[9].currp);
      }
      local_140 = (undefined1  [8])&PTR__Pass_00d722d8;
      if (updater.super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
          super_Pass.runner != (PassRunner *)psVar1) {
        operator_delete(updater.
                        super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>.
                        super_Pass.runner,
                        CONCAT71(updater.
                                 super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>
                                 .super_Pass.name._M_string_length._1_7_,
                                 (undefined1)
                                 updater.
                                 super_WalkerPass<wasm::PostWalker<Updater,_wasm::Visitor<Updater,_void>_>_>
                                 .super_Pass.name._M_string_length) + 1);
      }
      return;
    }
    pFVar3 = Module::getFunctionOrNull(wasm,(Name)*(string_view *)(p_Var5 + 1));
    if (pFVar3 != (Function *)0x0) {
      pFVar4 = Module::getFunctionOrNull(wasm,(IString)*(IString *)&p_Var5[1]._M_left);
      if ((pFVar4 != (Function *)0x0) &&
         ((_Base_ptr)(pFVar3->super_Importable).super_Named.name.super_IString.str._M_str !=
          p_Var5[1]._M_right)) {
        __assert_fail("!wasm.getFunctionOrNull(newName) || func->name == newName",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                      ,0xb8,
                      "void wasm::ModuleUtils::renameFunctions(Module &, T &) [T = std::map<wasm::Name, wasm::Name>]"
                     );
      }
      p_Var2 = p_Var5[1]._M_right;
      (pFVar3->super_Importable).super_Named.name.super_IString.str._M_len =
           (size_t)p_Var5[1]._M_left;
      (pFVar3->super_Importable).super_Named.name.super_IString.str._M_str = (char *)p_Var2;
    }
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

inline void renameFunctions(Module& wasm, T& map) {
  // Update the function itself.
  for (auto& [oldName, newName] : map) {
    if (Function* func = wasm.getFunctionOrNull(oldName)) {
      assert(!wasm.getFunctionOrNull(newName) || func->name == newName);
      func->name = newName;
    }
  }
  wasm.updateMaps();

  // Update all references to it.
  struct Updater : public WalkerPass<PostWalker<Updater>> {
    bool isFunctionParallel() override { return true; }

    T& map;

    void maybeUpdate(Name& name) {
      if (auto iter = map.find(name); iter != map.end()) {
        name = iter->second;
      }
    }

    Updater(T& map) : map(map) {}

    std::unique_ptr<Pass> create() override {
      return std::make_unique<Updater>(map);
    }

    void visitCall(Call* curr) { maybeUpdate(curr->target); }

    void visitRefFunc(RefFunc* curr) { maybeUpdate(curr->func); }
  };

  Updater updater(map);
  updater.maybeUpdate(wasm.start);
  PassRunner runner(&wasm);
  updater.run(&runner, &wasm);
  updater.runOnModuleCode(&runner, &wasm);
}